

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O2

void reshape(GLFWwindow *window,int w,int h)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float p;
  float fVar4;
  vec3 center;
  vec3 f;
  vec4 r;
  mat4x4 view;
  float local_150 [4];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float afStack_d8 [4];
  float local_c8 [5];
  float fStack_b4;
  float local_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  undefined4 local_9c;
  float local_98;
  float local_94;
  float local_90;
  undefined4 local_8c;
  float local_88;
  float local_84;
  float local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float local_68 [16];
  
  (*glad_glViewport)(0,0,w,h);
  (*glad_glMatrixMode)(0x1701);
  local_68[0] = 2.857143 / ((float)w / (float)h);
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 2.857143;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[8] = 0.0;
  local_68[9] = 0.0;
  local_68[10] = -1.003125;
  local_68[0xb] = -1.0;
  local_68[0xc] = 0.0;
  local_68[0xd] = 0.0;
  local_68[0xe] = -2.003125;
  local_68[0xf] = 0.0;
  (*glad_glLoadMatrixf)(local_68);
  (*glad_glMatrixMode)(0x1700);
  local_150[2] = 0.0;
  local_150[0] = 0.0;
  local_150[1] = 0.0;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    *(float *)((long)local_150 + lVar3 + 0xc) =
         *(float *)((long)local_150 + lVar3) - *(float *)((long)&DAT_00122130 + lVar3);
  }
  vec3_norm(local_150 + 3,local_150 + 3);
  local_f8 = -local_150[3];
  uStack_f4 = 0x80000000;
  uStack_f0 = 0x80000000;
  uStack_ec = 0x80000000;
  local_118 = ZEXT416((uint)local_150[3]);
  fVar4 = (float)local_140;
  local_128 = (float)((ulong)local_140 >> 0x20);
  local_138 = local_140;
  uStack_130 = 0;
  local_e8 = -local_128;
  fStack_e4 = -local_128;
  fStack_e0 = -local_128;
  fStack_dc = -local_128;
  local_c8[4] = fVar4 * 0.0 + local_128;
  fStack_b4 = local_128 * 0.0 + local_150[3] * -0.0;
  local_108 = -fVar4;
  fStack_104 = -local_128;
  uStack_100 = 0x80000000;
  uStack_fc = 0x80000000;
  local_b0 = fVar4 * -0.0 - local_150[3];
  fStack_124 = local_128;
  fStack_120 = local_128;
  fStack_11c = local_128;
  vec3_norm(local_c8 + 4,local_c8 + 4);
  pfVar1 = &local_a8;
  local_a8 = local_c8[4];
  local_a4 = fStack_b4 * local_128 - (float)local_138 * local_b0;
  local_a0 = local_f8;
  local_9c = 0;
  local_98 = fStack_b4;
  local_94 = local_b0 * (float)local_118._0_4_ - local_128 * local_c8[4];
  local_90 = local_108;
  local_8c = 0;
  local_88 = local_b0;
  local_84 = local_c8[4] * (float)local_138 - (float)local_118._0_4_ * fStack_b4;
  local_80 = local_e8;
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0x3f800000;
  local_c8[0] = -0.0;
  local_c8[1] = -0.0;
  local_c8[2] = -641.0;
  local_c8[3] = 0.0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      *(float *)((long)afStack_d8 + lVar2) = pfVar1[lVar2];
    }
    fVar4 = 0.0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      fVar4 = fVar4 + local_c8[lVar2] * afStack_d8[lVar2];
    }
    *(float *)((long)&local_7c + lVar3 * 4 + 4) =
         fVar4 + *(float *)((long)&local_7c + lVar3 * 4 + 4);
    pfVar1 = pfVar1 + 1;
  }
  (*glad_glLoadMatrixf)(&local_a8);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int w, int h )
{
   mat4x4 projection, view;

   glViewport( 0, 0, (GLsizei)w, (GLsizei)h );

   glMatrixMode( GL_PROJECTION );
   mat4x4_perspective( projection,
                       2.f * (float) atan2( RADIUS, 200.f ),
                       (float)w / (float)h,
                       1.f, VIEW_SCENE_DIST );
   glLoadMatrixf((const GLfloat*) projection);

   glMatrixMode( GL_MODELVIEW );
   {
      vec3 eye = { 0.f, 0.f, VIEW_SCENE_DIST };
      vec3 center = { 0.f, 0.f, 0.f };
      vec3 up = { 0.f, -1.f, 0.f };
      mat4x4_look_at( view, eye, center, up );
   }
   glLoadMatrixf((const GLfloat*) view);
}